

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O1

void __thiscall wallet::setAmountOnEachBtc(wallet *this,linkedList<int> *amountOnEachBtc)

{
  linkedList<int>::clear(&this->amountOnEachBtc);
  do {
    amountOnEachBtc = (linkedList<int> *)amountOnEachBtc->head;
    linkedList<int>::insert_last(&this->amountOnEachBtc,*(int *)&amountOnEachBtc->_vptr_linkedList);
  } while( true );
}

Assistant:

void wallet::setAmountOnEachBtc( linkedList<int> &amountOnEachBtc) {
    wallet::amountOnEachBtc = amountOnEachBtc;
}